

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blech32.c
# Opt level: O0

uint64_t blech32_polymod_step(uint64_t pre)

{
  byte bVar1;
  uint8_t b;
  uint64_t pre_local;
  
  bVar1 = (byte)(pre >> 0x37);
  return (pre & 0x7fffffffffffff) << 5 ^ (long)(int)-(bVar1 & 1) & 0x7d52fba40bd886U ^
         (long)(int)-((int)(uint)bVar1 >> 1 & 1U) & 0x5e8dbf1a03950cU ^
         (long)(int)-((int)(uint)bVar1 >> 2 & 1U) & 0x1c3a3c74072a18U ^
         (long)(int)-((int)(uint)bVar1 >> 3 & 1U) & 0x385d72fa0e5139U ^
         (long)(int)-((int)(uint)bVar1 >> 4 & 1U) & 0x7093e5a608865bU;
}

Assistant:

static uint64_t blech32_polymod_step(uint64_t pre) {
    uint8_t b = pre >> 55;
    return ((pre & 0x7fffffffffffffULL) << 5) ^
           (-((b >> 0) & 1) & 0x7d52fba40bd886ULL) ^
           (-((b >> 1) & 1) & 0x5e8dbf1a03950cULL) ^
           (-((b >> 2) & 1) & 0x1c3a3c74072a18ULL) ^
           (-((b >> 3) & 1) & 0x385d72fa0e5139ULL) ^
           (-((b >> 4) & 1) & 0x7093e5a608865bULL);
}